

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

bool nlohmann::operator==(const_reference lhs,const_reference rhs)

{
  value_t vVar1;
  value_t vVar2;
  const_reference pvVar3;
  object_t *poVar4;
  double dVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  const_reference lhs_00;
  pointer pbVar9;
  
  vVar1 = lhs->m_type;
  vVar2 = rhs->m_type;
  if (vVar1 == vVar2) {
    bVar7 = true;
    bVar6 = true;
    switch(vVar1) {
    case null:
      goto switchD_00198e2f_caseD_0;
    case object:
      poVar4 = (lhs->m_value).object;
      if ((poVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count ==
          (((rhs->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count) {
        bVar7 = std::__equal<false>::
                equal<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
                          ((poVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                           (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                            )&(poVar4->_M_t)._M_impl.super__Rb_tree_header,
                           (((rhs->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header.
                           _M_left);
        return bVar7;
      }
      break;
    case array:
      lhs_00 = (((lhs->m_value).array)->
               super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pvVar3 = (((lhs->m_value).array)->
               super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      pbVar9 = (((rhs->m_value).array)->
               super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((long)pvVar3 - (long)lhs_00 ==
          (long)(((rhs->m_value).array)->
                super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9) {
        while( true ) {
          if (lhs_00 == pvVar3) {
            return bVar7;
          }
          bVar7 = operator==(lhs_00,pbVar9);
          if (!bVar7) break;
          lhs_00 = lhs_00 + 1;
          pbVar9 = pbVar9 + 1;
        }
        return bVar7;
      }
      break;
    case string:
      pbVar9 = (pointer)((lhs->m_value).string)->_M_string_length;
      if (pbVar9 == (((rhs->m_value).array)->
                    super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish) {
        if (pbVar9 == (pointer)0x0) {
          return true;
        }
        iVar8 = bcmp((((lhs->m_value).string)->_M_dataplus)._M_p,
                     (((rhs->m_value).array)->
                     super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,(size_t)pbVar9);
        return iVar8 == 0;
      }
      break;
    case boolean:
      return (lhs->m_value).boolean == (rhs->m_value).boolean;
    case number_integer:
    case number_unsigned:
switchD_00198e2f_caseD_5:
      return (lhs->m_value).object == (rhs->m_value).object;
    case number_float:
      dVar5 = (rhs->m_value).number_float;
LAB_00198eff:
      bVar7 = dVar5 == (lhs->m_value).number_float;
LAB_00198f0a:
      return (bool)(-bVar7 & 1);
    }
  }
  else {
    if (vVar1 == number_integer && (vVar2 ^ number_float) == null) {
      bVar7 = (double)(lhs->m_value).number_integer == (rhs->m_value).number_float;
      goto LAB_00198f0a;
    }
    if (vVar1 == number_float && (vVar2 ^ number_integer) == null) {
      dVar5 = (double)(rhs->m_value).number_integer;
      goto LAB_00198eff;
    }
    if (vVar1 == number_unsigned && (vVar2 ^ number_float) == null) {
      bVar7 = ((double)CONCAT44(0x45300000,(int)((ulong)(lhs->m_value).number_integer >> 0x20)) -
              1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)(lhs->m_value).number_integer) - 4503599627370496.0)
              == (rhs->m_value).number_float;
      goto LAB_00198f0a;
    }
    if (vVar1 == number_float && (vVar2 ^ number_unsigned) == null) {
      bVar7 = ((double)CONCAT44(0x45300000,(int)((ulong)(rhs->m_value).number_integer >> 0x20)) -
              1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)(rhs->m_value).number_integer) - 4503599627370496.0)
              == (lhs->m_value).number_float;
      goto LAB_00198f0a;
    }
    if ((vVar1 == number_unsigned && (vVar2 ^ number_integer) == null) ||
       (vVar1 == number_integer && (vVar2 ^ number_unsigned) == null))
    goto switchD_00198e2f_caseD_5;
  }
  bVar6 = false;
switchD_00198e2f_caseD_0:
  return bVar6;
}

Assistant:

constexpr value_t type() const noexcept { return m_type; }